

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O0

void la_dcrossop(double *x,int incx,double *a,int lda)

{
  int lda_local;
  double *a_local;
  int incx_local;
  double *x_local;
  
  if (x == (double *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x93,"void la_dcrossop(const double *, int, double *, int)");
  }
  if (a != (double *)0x0) {
    *a = 0.0;
    a[1] = -x[incx << 1];
    a[2] = x[incx];
    a[lda] = x[incx << 1];
    a[lda + 1] = 0.0;
    a[lda + 2] = -*x;
    a[lda << 1] = -x[incx];
    a[lda * 2 + 1] = *x;
    a[lda * 2 + 2] = 0.0;
    return;
  }
  __assert_fail("a",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0x94,"void la_dcrossop(const double *, int, double *, int)");
}

Assistant:

void la_dcrossop(
        const double *x, int incx,
        double *a, int lda)
{
    assert(x);
    assert(a);

    a[0 * lda + 0] =          0.0; a[0 * lda + 1] = -x[2 * incx]; a[0 * lda + 2] =  x[1 * incx];
    a[1 * lda + 0] =  x[2 * incx]; a[1 * lda + 1] =          0.0; a[1 * lda + 2] = -x[0 * incx];
    a[2 * lda + 0] = -x[1 * incx]; a[2 * lda + 1] =  x[0 * incx]; a[2 * lda + 2] =          0.0;
}